

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void duckdb::GenerateKeysInternal<true>
               (ArenaAllocator *allocator,DataChunk *input,unsafe_vector<ARTKey> *keys)

{
  long *plVar1;
  float fVar2;
  double dVar3;
  PhysicalType PVar4;
  data_t dVar5;
  ushort uVar6;
  pointer pAVar7;
  ulong uVar8;
  undefined8 uVar9;
  bool bVar10;
  reference pvVar11;
  idx_t iVar12;
  ulong *puVar13;
  ushort *puVar14;
  uint *puVar15;
  data_ptr_t pdVar16;
  idx_t iVar17;
  size_t __n;
  data_ptr_t pdVar18;
  InternalException *pIVar19;
  uint uVar20;
  ulong uVar21;
  size_type sVar22;
  long lVar23;
  idx_t iVar24;
  ARTKey AVar25;
  string_t value;
  string_t value_00;
  UnifiedVectorFormat data;
  undefined1 local_98 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  ARTKey local_50;
  size_type local_40;
  idx_t local_38;
  
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  PVar4 = (pvVar11->type).physical_type_;
  if (PVar4 < VARCHAR) {
    switch(PVar4) {
    case BOOL:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar5 = *(data_t *)(uVar9 + iVar12);
          pdVar18 = ArenaAllocator::Allocate(allocator,1);
          *pdVar18 = dVar5;
          *(data_ptr_t *)((long)&pAVar7->len + lVar23) = pdVar18;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 1;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case UINT8:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar5 = *(data_t *)(uVar9 + iVar12);
          pdVar18 = ArenaAllocator::Allocate(allocator,1);
          *pdVar18 = dVar5;
          *(data_ptr_t *)((long)&pAVar7->len + lVar23) = pdVar18;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 1;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case INT8:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar5 = *(data_ptr_t)(uVar9 + iVar12);
          pdVar18 = ArenaAllocator::Allocate(allocator,1);
          *pdVar18 = dVar5 + 0x80;
          *(data_ptr_t *)((long)&pAVar7->len + lVar23) = pdVar18;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 1;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case UINT16:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = *(ushort *)(uVar9 + iVar12 * 2);
          puVar14 = (ushort *)ArenaAllocator::Allocate(allocator,2);
          *puVar14 = uVar6 << 8 | uVar6 >> 8;
          *(ushort **)((long)&pAVar7->len + lVar23) = puVar14;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 2;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case INT16:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = *(ushort *)(uVar9 + iVar12 * 2);
          puVar14 = (ushort *)ArenaAllocator::Allocate(allocator,2);
          *puVar14 = uVar6 << 8 | uVar6 >> 8;
          *(data_t *)puVar14 = (char)(uVar6 >> 8) + 0x80;
          *(ushort **)((long)&pAVar7->len + lVar23) = puVar14;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 2;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case UINT32:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar20 = *(uint *)(uVar9 + iVar12 * 4);
          puVar15 = (uint *)ArenaAllocator::Allocate(allocator,4);
          *puVar15 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18;
          *(uint **)((long)&pAVar7->len + lVar23) = puVar15;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 4;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case INT32:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar20 = *(uint *)(uVar9 + iVar12 * 4);
          puVar15 = (uint *)ArenaAllocator::Allocate(allocator,4);
          *puVar15 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18;
          *(data_t *)puVar15 = (char)(uVar20 >> 0x18) + 0x80;
          *(uint **)((long)&pAVar7->len + lVar23) = puVar15;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 4;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case UINT64:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar21 = *(ulong *)(uVar9 + iVar12 * 8);
          puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,8);
          *puVar13 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                     (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                     (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                     (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
          *(ulong **)((long)&pAVar7->len + lVar23) = puVar13;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 8;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case INT64:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar21 = *(ulong *)(uVar9 + iVar12 * 8);
          puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,8);
          *puVar13 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                     (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                     (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                     (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
          *(data_t *)puVar13 = (char)(uVar21 >> 0x38) + 0x80;
          *(ulong **)((long)&pAVar7->len + lVar23) = puVar13;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 8;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    default:
switchD_015d74e3_caseD_a:
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      local_98._0_8_ = local_98 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid type for index","");
      InternalException::InternalException(pIVar19,(string *)local_98);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar2 = *(float *)(uVar9 + iVar12 * 4);
          puVar15 = (uint *)ArenaAllocator::Allocate(allocator,4);
          if ((fVar2 != 0.0) || (uVar20 = 0x80000000, NAN(fVar2))) {
            bVar10 = Value::IsNan<float>(fVar2);
            uVar20 = 0xffffffff;
            if ((!bVar10) &&
               ((uVar20 = 0xfffffffe, fVar2 <= 3.4028235e+38 &&
                (uVar20 = 0, -3.4028235e+38 <= fVar2)))) {
              uVar20 = ~(uint)fVar2;
              if (-1 < (int)fVar2) {
                uVar20 = (uint)fVar2 | 0x80000000;
              }
            }
          }
          *puVar15 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18;
          *(uint **)((long)&pAVar7->len + lVar23) = puVar15;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 4;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      break;
    case DOUBLE:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar3 = *(double *)(uVar9 + iVar12 * 8);
          puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,8);
          if ((dVar3 != 0.0) || (uVar21 = 0x8000000000000000, NAN(dVar3))) {
            bVar10 = Value::IsNan<double>(dVar3);
            uVar21 = 0xffffffffffffffff;
            if ((!bVar10) && (uVar21 = 0xfffffffffffffffe, dVar3 <= 1.79769313486232e+308)) {
              if (-1.79769313486232e+308 <= dVar3) {
                uVar21 = ~(ulong)dVar3;
                if (-1 < (long)dVar3) {
                  uVar21 = (ulong)dVar3 | 0x8000000000000000;
                }
              }
              else {
                uVar21 = 0;
              }
            }
          }
          *puVar13 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                     (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                     (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                     (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
          *(ulong **)((long)&pAVar7->len + lVar23) = puVar13;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 8;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
    }
  }
  else {
    if (PVar4 == VARCHAR) {
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          value_00.value.pointer.ptr = (char *)keys;
          value_00.value._0_8_ = *(undefined8 *)(uVar9 + iVar12 * 0x10 + 8);
          AVar25 = ARTKey::CreateARTKey<duckdb::string_t>
                             ((ARTKey *)allocator,*(ArenaAllocator **)(uVar9 + iVar12 * 0x10),
                              value_00);
          *(idx_t *)((long)pAVar7 + lVar23 + -8) = AVar25.len;
          *(data_ptr_t *)((long)&pAVar7->len + lVar23) = AVar25.data;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
      goto joined_r0x015d8e65;
    }
    if (PVar4 == UINT128) {
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar21 = *(ulong *)(uVar9 + iVar12 * 0x10);
          uVar8 = *(ulong *)(uVar9 + iVar12 * 0x10 + 8);
          puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
          *puVar13 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          puVar13[1] = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                       (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                       (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                       (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
          *(ulong **)((long)&pAVar7->len + lVar23) = puVar13;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 0x10;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
    }
    else {
      if (PVar4 != INT128) goto switchD_015d74e3_caseD_a;
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      iVar17 = input->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
      uVar9 = local_98._8_8_;
      if (iVar17 != 0) {
        lVar23 = 8;
        iVar24 = 0;
        do {
          iVar12 = iVar24;
          if (*(long *)local_98._0_8_ != 0) {
            iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
          }
          pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                   super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar21 = *(ulong *)(uVar9 + iVar12 * 0x10);
          uVar8 = *(ulong *)(uVar9 + iVar12 * 0x10 + 8);
          puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
          *puVar13 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          *(data_t *)puVar13 = (char)(uVar8 >> 0x38) + 0x80;
          puVar13[1] = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                       (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                       (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                       (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
          *(ulong **)((long)&pAVar7->len + lVar23) = puVar13;
          *(undefined8 *)((long)pAVar7 + lVar23 + -8) = 0x10;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + 0x10;
        } while (iVar17 != iVar24);
      }
    }
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
joined_r0x015d8e65:
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  if (1 < (ulong)(((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    sVar22 = 1;
    do {
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
      PVar4 = (pvVar11->type).physical_type_;
      local_40 = sVar22;
      if (PVar4 < VARCHAR) {
        switch(PVar4) {
        case BOOL:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              dVar5 = *(data_t *)(uVar9 + iVar12);
              pdVar18 = ArenaAllocator::Allocate(allocator,1);
              *pdVar18 = dVar5;
              ARTKey::ARTKey(&local_50,pdVar18,1);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case UINT8:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              dVar5 = *(data_t *)(uVar9 + iVar12);
              pdVar18 = ArenaAllocator::Allocate(allocator,1);
              *pdVar18 = dVar5;
              ARTKey::ARTKey(&local_50,pdVar18,1);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case INT8:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              dVar5 = *(data_ptr_t)(uVar9 + iVar12);
              pdVar18 = ArenaAllocator::Allocate(allocator,1);
              *pdVar18 = dVar5 + 0x80;
              ARTKey::ARTKey(&local_50,pdVar18,1);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case UINT16:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              uVar6 = *(ushort *)(uVar9 + iVar12 * 2);
              puVar14 = (ushort *)ArenaAllocator::Allocate(allocator,2);
              *puVar14 = uVar6 << 8 | uVar6 >> 8;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar14,2);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case INT16:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              uVar6 = *(ushort *)(uVar9 + iVar12 * 2);
              puVar14 = (ushort *)ArenaAllocator::Allocate(allocator,2);
              *puVar14 = uVar6 << 8 | uVar6 >> 8;
              *(data_t *)puVar14 = (char)(uVar6 >> 8) + 0x80;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar14,2);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case UINT32:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              uVar20 = *(uint *)(uVar9 + iVar12 * 4);
              puVar15 = (uint *)ArenaAllocator::Allocate(allocator,4);
              *puVar15 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar15,4);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case INT32:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              uVar20 = *(uint *)(uVar9 + iVar12 * 4);
              puVar15 = (uint *)ArenaAllocator::Allocate(allocator,4);
              *puVar15 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18;
              *(data_t *)puVar15 = (char)(uVar20 >> 0x18) + 0x80;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar15,4);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case UINT64:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              uVar21 = *(ulong *)(uVar9 + iVar12 * 8);
              puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,8);
              *puVar13 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                         (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                         (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar13,8);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        case INT64:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            do {
              iVar12 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              uVar21 = *(ulong *)(uVar9 + iVar12 * 8);
              puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,8);
              *puVar13 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                         (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                         (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
              *(data_t *)puVar13 = (char)(uVar21 >> 0x38) + 0x80;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar13,8);
              pdVar18 = local_50.data;
              iVar12 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar12;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (iVar17 != iVar24);
          }
          break;
        default:
switchD_015d7e54_caseD_a:
          pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
          local_98._0_8_ = local_98 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Invalid type for index","");
          InternalException::InternalException(pIVar19,(string *)local_98);
          __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        case FLOAT:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            local_38 = iVar17;
            do {
              iVar17 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar17 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              fVar2 = *(float *)(uVar9 + iVar17 * 4);
              puVar15 = (uint *)ArenaAllocator::Allocate(allocator,4);
              if ((fVar2 != 0.0) || (uVar20 = 0x80000000, NAN(fVar2))) {
                bVar10 = Value::IsNan<float>(fVar2);
                uVar20 = 0xffffffff;
                if ((!bVar10) &&
                   ((uVar20 = 0xfffffffe, fVar2 <= 3.4028235e+38 &&
                    (uVar20 = 0, -3.4028235e+38 <= fVar2)))) {
                  uVar20 = ~(uint)fVar2;
                  if (-1 < (int)fVar2) {
                    uVar20 = (uint)fVar2 | 0x80000000;
                  }
                }
              }
              *puVar15 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar15,4);
              pdVar18 = local_50.data;
              iVar17 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar17);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar17;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (local_38 != iVar24);
          }
          break;
        case DOUBLE:
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
          iVar17 = input->count;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
          Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
          uVar9 = local_98._8_8_;
          if (iVar17 != 0) {
            lVar23 = 0;
            iVar24 = 0;
            local_38 = iVar17;
            do {
              iVar17 = iVar24;
              if (*(long *)local_98._0_8_ != 0) {
                iVar17 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
              }
              dVar3 = *(double *)(uVar9 + iVar17 * 8);
              puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,8);
              if ((dVar3 != 0.0) || (uVar21 = 0x8000000000000000, NAN(dVar3))) {
                bVar10 = Value::IsNan<double>(dVar3);
                uVar21 = 0xffffffffffffffff;
                if ((!bVar10) && (uVar21 = 0xfffffffffffffffe, dVar3 <= 1.79769313486232e+308)) {
                  if (-1.79769313486232e+308 <= dVar3) {
                    uVar21 = ~(ulong)dVar3;
                    if (-1 < (long)dVar3) {
                      uVar21 = (ulong)dVar3 | 0x8000000000000000;
                    }
                  }
                  else {
                    uVar21 = 0;
                  }
                }
              }
              *puVar13 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                         (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                         (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
              ARTKey::ARTKey(&local_50,(data_ptr_t)puVar13,8);
              pdVar18 = local_50.data;
              iVar17 = local_50.len;
              pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = ArenaAllocator::Allocate
                                  (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
              switchD_012e1ce8::default
                        (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                         *(size_t *)((long)&pAVar7->len + lVar23));
              switchD_012e1ce8::default
                        (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar17);
              plVar1 = (long *)((long)&pAVar7->len + lVar23);
              *plVar1 = *plVar1 + iVar17;
              *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
              iVar24 = iVar24 + 1;
              lVar23 = lVar23 + 0x10;
            } while (local_38 != iVar24);
          }
        }
      }
      else if (PVar4 == VARCHAR) {
        pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
        iVar17 = input->count;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
        Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
        uVar9 = local_98._8_8_;
        if (iVar17 != 0) {
          lVar23 = 0;
          iVar24 = 0;
          do {
            iVar12 = iVar24;
            if (*(long *)local_98._0_8_ != 0) {
              iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
            }
            value.value.pointer.ptr = (char *)uVar9;
            value.value._0_8_ = *(undefined8 *)(uVar9 + iVar12 * 0x10 + 8);
            AVar25 = ARTKey::CreateARTKey<duckdb::string_t>
                               ((ARTKey *)allocator,*(ArenaAllocator **)(uVar9 + iVar12 * 0x10),
                                value);
            __n = AVar25.len;
            pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar18 = ArenaAllocator::Allocate
                                (allocator,*(long *)((long)&pAVar7->len + lVar23) + __n);
            switchD_012e1ce8::default
                      (pdVar18,*(void **)((long)&pAVar7->data + lVar23),
                       *(size_t *)((long)&pAVar7->len + lVar23));
            switchD_012e1ce8::default
                      (pdVar18 + *(long *)((long)&pAVar7->len + lVar23),AVar25.data,__n);
            plVar1 = (long *)((long)&pAVar7->len + lVar23);
            *plVar1 = *plVar1 + __n;
            *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar18;
            iVar24 = iVar24 + 1;
            lVar23 = lVar23 + 0x10;
          } while (iVar17 != iVar24);
        }
      }
      else if (PVar4 == UINT128) {
        pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
        iVar17 = input->count;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
        Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
        uVar9 = local_98._8_8_;
        if (iVar17 != 0) {
          lVar23 = 0;
          iVar24 = 0;
          do {
            iVar12 = iVar24;
            if (*(long *)local_98._0_8_ != 0) {
              iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
            }
            uVar21 = *(ulong *)(uVar9 + iVar12 * 0x10);
            uVar8 = *(ulong *)(uVar9 + iVar12 * 0x10 + 8);
            puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
            *puVar13 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            puVar13[1] = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                         (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                         (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
            ARTKey::ARTKey(&local_50,(data_ptr_t)puVar13,0x10);
            pdVar18 = local_50.data;
            iVar12 = local_50.len;
            pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar16 = ArenaAllocator::Allocate
                                (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
            switchD_012e1ce8::default
                      (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                       *(size_t *)((long)&pAVar7->len + lVar23));
            switchD_012e1ce8::default
                      (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
            plVar1 = (long *)((long)&pAVar7->len + lVar23);
            *plVar1 = *plVar1 + iVar12;
            *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
            iVar24 = iVar24 + 1;
            lVar23 = lVar23 + 0x10;
          } while (iVar17 != iVar24);
        }
      }
      else {
        if (PVar4 != INT128) goto switchD_015d7e54_caseD_a;
        pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar22);
        iVar17 = input->count;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
        Vector::ToUnifiedFormat(pvVar11,iVar17,(UnifiedVectorFormat *)local_98);
        uVar9 = local_98._8_8_;
        if (iVar17 != 0) {
          lVar23 = 0;
          iVar24 = 0;
          do {
            iVar12 = iVar24;
            if (*(long *)local_98._0_8_ != 0) {
              iVar12 = (idx_t)*(uint *)(*(long *)local_98._0_8_ + iVar24 * 4);
            }
            uVar21 = *(ulong *)(uVar9 + iVar12 * 0x10);
            uVar8 = *(ulong *)(uVar9 + iVar12 * 0x10 + 8);
            puVar13 = (ulong *)ArenaAllocator::Allocate(allocator,0x10);
            *puVar13 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            *(data_t *)puVar13 = (char)(uVar8 >> 0x38) + 0x80;
            puVar13[1] = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                         (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                         (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
            ARTKey::ARTKey(&local_50,(data_ptr_t)puVar13,0x10);
            pdVar18 = local_50.data;
            iVar12 = local_50.len;
            pAVar7 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                     super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar16 = ArenaAllocator::Allocate
                                (allocator,*(long *)((long)&pAVar7->len + lVar23) + local_50.len);
            switchD_012e1ce8::default
                      (pdVar16,*(void **)((long)&pAVar7->data + lVar23),
                       *(size_t *)((long)&pAVar7->len + lVar23));
            switchD_012e1ce8::default
                      (pdVar16 + *(long *)((long)&pAVar7->len + lVar23),pdVar18,iVar12);
            plVar1 = (long *)((long)&pAVar7->len + lVar23);
            *plVar1 = *plVar1 + iVar12;
            *(data_ptr_t *)((long)&pAVar7->data + lVar23) = pdVar16;
            iVar24 = iVar24 + 1;
            lVar23 = lVar23 + 0x10;
          } while (iVar17 != iVar24);
        }
      }
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
      sVar22 = local_40;
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 < (ulong)(((long)(input->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(input->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void GenerateKeysInternal(ArenaAllocator &allocator, DataChunk &input, unsafe_vector<ARTKey> &keys) {
	switch (input.data[0].GetType().InternalType()) {
	case PhysicalType::BOOL:
		TemplatedGenerateKeys<bool, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT8:
		TemplatedGenerateKeys<int8_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT16:
		TemplatedGenerateKeys<int16_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT32:
		TemplatedGenerateKeys<int32_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT64:
		TemplatedGenerateKeys<int64_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::INT128:
		TemplatedGenerateKeys<hugeint_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT8:
		TemplatedGenerateKeys<uint8_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT16:
		TemplatedGenerateKeys<uint16_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT32:
		TemplatedGenerateKeys<uint32_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT64:
		TemplatedGenerateKeys<uint64_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::UINT128:
		TemplatedGenerateKeys<uhugeint_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::FLOAT:
		TemplatedGenerateKeys<float, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGenerateKeys<double, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	case PhysicalType::VARCHAR:
		TemplatedGenerateKeys<string_t, IS_NOT_NULL>(allocator, input.data[0], input.size(), keys);
		break;
	default:
		throw InternalException("Invalid type for index");
	}

	// We concatenate the keys for each remaining column of a compound key.
	for (idx_t i = 1; i < input.ColumnCount(); i++) {
		switch (input.data[i].GetType().InternalType()) {
		case PhysicalType::BOOL:
			ConcatenateKeys<bool, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT8:
			ConcatenateKeys<int8_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT16:
			ConcatenateKeys<int16_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT32:
			ConcatenateKeys<int32_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT64:
			ConcatenateKeys<int64_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::INT128:
			ConcatenateKeys<hugeint_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT8:
			ConcatenateKeys<uint8_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT16:
			ConcatenateKeys<uint16_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT32:
			ConcatenateKeys<uint32_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT64:
			ConcatenateKeys<uint64_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::UINT128:
			ConcatenateKeys<uhugeint_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::FLOAT:
			ConcatenateKeys<float, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::DOUBLE:
			ConcatenateKeys<double, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		case PhysicalType::VARCHAR:
			ConcatenateKeys<string_t, IS_NOT_NULL>(allocator, input.data[i], input.size(), keys);
			break;
		default:
			throw InternalException("Invalid type for index");
		}
	}
}